

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ForLoopStatement *stmt)

{
  size_t sVar1;
  pointer ppEVar2;
  pointer ppVVar3;
  bool bVar4;
  Expression *pEVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  type oldBreakStates;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_70;
  char local_50;
  
  sVar1 = (stmt->initializers)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (stmt->initializers)._M_ptr;
    lVar7 = 0;
    do {
      pEVar5 = *(Expression **)((long)ppEVar2 + lVar7);
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar5,pEVar5,(TestAnalysis *)this);
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  sVar1 = (stmt->loopVars)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppVVar3 = (stmt->loopVars)._M_ptr;
    lVar7 = 0;
    do {
      pEVar5 = ast::DeclaredType::getInitializer
                         ((DeclaredType *)(*(long *)((long)ppVVar3 + lVar7) + 0x40));
      if (pEVar5 != (Expression *)0x0) {
        ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                  (pEVar5,pEVar5,(TestAnalysis *)this);
      }
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  pEVar5 = stmt->stopExpr;
  if (pEVar5 == (Expression *)0x0) {
    iVar6 = this->state;
    iVar8 = 0;
    bVar4 = false;
  }
  else {
    bVar4 = this->inCondition;
    this->inCondition = true;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar5,pEVar5,(TestAnalysis *)this);
    this->inCondition = bVar4;
    adjustConditionalState((ConstantValue *)&local_70,this,pEVar5);
    iVar6 = this->stateWhenTrue;
    iVar8 = this->stateWhenFalse;
    bVar4 = false;
    if ((local_50 == '\0') && (bVar4 = false, (stmt->loopVars)._M_extent._M_extent_value != 0)) {
      bVar4 = FlowAnalysisBase::willIterateAtLeastOnce
                        (&this->super_FlowAnalysisBase,stmt->loopVars,stmt->stopExpr);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_70);
  }
  SmallVector<int,_10UL>::SmallVector
            ((SmallVector<int,_10UL> *)&local_70,&(this->breakStates).super_SmallVectorBase<int>);
  (this->breakStates).super_SmallVectorBase<int>.len = 0;
  this->isStateSplit = false;
  this->state = iVar6;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  ast::Statement::visit<TestAnalysis&>(stmt->body,(TestAnalysis *)this);
  sVar1 = (stmt->steps)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (stmt->steps)._M_ptr;
    lVar7 = 0;
    do {
      pEVar5 = *(Expression **)((long)ppEVar2 + lVar7);
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar5,pEVar5,(TestAnalysis *)this);
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  iVar6 = this->state;
  if (iVar8 <= this->state) {
    iVar6 = iVar8;
  }
  if (bVar4 == false) {
    iVar6 = iVar8;
  }
  loopTail(this,iVar6,(SmallVector<int,_10UL> *)&local_70);
  if ((void *)local_70._0_8_ != (void *)((long)&local_70 + 0x18)) {
    operator_delete((void *)local_70._0_8_);
  }
  return;
}

Assistant:

void visitStmt(const ForLoopStatement& stmt) {
        for (auto init : stmt.initializers)
            visit(*init);

        for (auto var : stmt.loopVars) {
            if (auto init = var->getInitializer())
                visit(*init);
        }

        bool bodyWillExecute = false;
        TState bodyState, exitState;
        if (stmt.stopExpr) {
            auto cv = visitCondition(*stmt.stopExpr);
            bodyState = std::move(stateWhenTrue);
            exitState = std::move(stateWhenFalse);

            // If we had a non-constant stop expression we want
            // to check whether there's at least a guarantee that
            // we will visit the loop body at least once, because then
            // we can allow the body state to definitely affect the
            // post-loop exit state.
            if (!cv && !stmt.loopVars.empty() &&
                willIterateAtLeastOnce(stmt.loopVars, *stmt.stopExpr)) {
                bodyWillExecute = true;
            }
        }
        else {
            // If there's no stop expression, the loop is infinite.
            bodyState = std::move(state);
            exitState = (DERIVED).unreachableState();
        }

        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        setState(std::move(bodyState));
        visit(stmt.body);

        for (auto step : stmt.steps)
            visit(*step);

        if (bodyWillExecute)
            (DERIVED).meetState(exitState, state);

        loopTail(std::move(exitState), std::move(oldBreakStates));
    }